

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper::
~initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper
          (initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper *this)

{
  ~initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper
            ((initiatorFixtureResendRequest_EndSeqNumberLargerThanMessagesHelper *)
             &this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_EndSeqNumberLargerThanMessages) {
  startLoggedOn();

  object->setNextSenderMsgSeqNum(15);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 20);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(15, object->getExpectedSenderNum());
  CHECK_EQUAL(3, object->getExpectedTargetNum());
}